

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv__try_write(uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle)

{
  uint uVar1;
  int *piVar2;
  bool bVar3;
  int *pi;
  void *pv;
  anon_union_64_2_d657c519 scratch;
  cmsghdr *cmsg;
  msghdr msg;
  ssize_t sStack_48;
  int fd_to_send;
  ssize_t n;
  int iovcnt;
  int iovmax;
  iovec *iov;
  uv_stream_t *send_handle_local;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_stream_t *stream_local;
  
  uVar1 = uv__getiovmax();
  n._0_4_ = nbufs;
  if ((int)uVar1 < (int)nbufs) {
    n._0_4_ = uVar1;
  }
  if (send_handle == (uv_stream_t *)0x0) {
    do {
      sStack_48 = uv__writev((stream->io_watcher).fd,(iovec *)bufs,(long)(int)(uint)n);
      bVar3 = false;
      if (sStack_48 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
  }
  else {
    if ((send_handle->flags & 3) != 0) {
      return -9;
    }
    msg._52_4_ = uv__handle_fd((uv_handle_t *)send_handle);
    memset(&pv,0,0x40);
    if ((int)msg._52_4_ < 0) {
      __assert_fail("fd_to_send >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                    ,0x34c,
                    "int uv__try_write(uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *)"
                   );
    }
    cmsg = (cmsghdr *)0x0;
    msg.msg_name._0_4_ = 0;
    msg.msg_iov = (iovec *)(long)(int)(uint)n;
    msg.msg_controllen._0_4_ = 0;
    scratch._56_8_ = &pv;
    msg.msg_control = (void *)0x18;
    scratch.alias.cmsg_len._0_4_ = 1;
    scratch.alias.cmsg_len._4_4_ = 1;
    pv = (void *)0x14;
    scratch.alias.cmsg_level = msg._52_4_;
    msg._8_8_ = bufs;
    msg.msg_iovlen = scratch._56_8_;
    do {
      sStack_48 = sendmsg((stream->io_watcher).fd,(msghdr *)&cmsg,0);
      bVar3 = false;
      if (sStack_48 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
  }
  if (sStack_48 < 0) {
    piVar2 = __errno_location();
    if (((*piVar2 == 0xb) || (piVar2 = __errno_location(), *piVar2 == 0xb)) ||
       (piVar2 = __errno_location(), *piVar2 == 0x69)) {
      stream_local._4_4_ = -0xb;
    }
    else {
      piVar2 = __errno_location();
      stream_local._4_4_ = -*piVar2;
    }
  }
  else {
    stream_local._4_4_ = (int)sStack_48;
  }
  return stream_local._4_4_;
}

Assistant:

static int uv__try_write(uv_stream_t* stream,
                         const uv_buf_t bufs[],
                         unsigned int nbufs,
                         uv_stream_t* send_handle) {
  struct iovec* iov;
  int iovmax;
  int iovcnt;
  ssize_t n;

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  iov = (struct iovec*) bufs;
  iovcnt = nbufs;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */
  if (send_handle != NULL) {
    int fd_to_send;
    struct msghdr msg;
    struct cmsghdr *cmsg;
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    if (uv__is_closing(send_handle))
      return UV_EBADF;

    fd_to_send = uv__handle_fd((uv_handle_t*) send_handle);

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));
  } else {
    do
      n = uv__writev(uv__stream_fd(stream), iov, iovcnt);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));
  }

  if (n >= 0)
    return n;

  if (IS_TRANSIENT_WRITE_ERROR(errno, send_handle))
    return UV_EAGAIN;

  return UV__ERR(errno);
}